

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_reader.cpp
# Opt level: O2

void __thiscall diffusion::Tokenizer::push(Tokenizer *this,string *raw_data)

{
  ErrorDataCorruption *this_00;
  ulong size;
  _Vector_base<char,_std::allocator<char>_> local_30;
  
  std::__cxx11::string::append((string *)this);
  size = (ulong)*(int *)(this->unprocessed_data_)._M_dataplus._M_p;
  std::__cxx11::string::erase((ulong)this,0);
  if (-1 < (long)size) {
    if (size <= (this->unprocessed_data_)._M_string_length) {
      std::mutex::lock(&this->queue_mutex_);
      to_vector_char((vector<char,_std::allocator<char>_> *)&local_30,
                     (this->unprocessed_data_)._M_dataplus._M_p,size);
      std::
      deque<std::vector<char,std::allocator<char>>,std::allocator<std::vector<char,std::allocator<char>>>>
      ::emplace_back<std::vector<char,std::allocator<char>>>
                ((deque<std::vector<char,std::allocator<char>>,std::allocator<std::vector<char,std::allocator<char>>>>
                  *)&this->processed_data_queue_,(vector<char,_std::allocator<char>_> *)&local_30);
      std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_30);
      std::__cxx11::string::erase((ulong)this,0);
      pthread_mutex_unlock((pthread_mutex_t *)&this->queue_mutex_);
    }
    return;
  }
  this_00 = (ErrorDataCorruption *)__cxa_allocate_exception(0x10);
  ErrorDataCorruption::ErrorDataCorruption(this_00);
  __cxa_throw(this_00,&ErrorDataCorruption::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void push(std::string const & raw_data) {
        unprocessed_data_ += raw_data;
        auto message_length = *reinterpret_cast<Size *>(&unprocessed_data_[0]);
        unprocessed_data_.erase(0, sizeof(Size));
        if (message_length < 0)
            throw ErrorDataCorruption();
        if (static_cast<std::size_t>(message_length) > unprocessed_data_.size()) {
        } else {
            std::lock_guard<std::mutex> lock(queue_mutex_);
            processed_data_queue_.push_back(to_vector_char(&unprocessed_data_[0], message_length));
            unprocessed_data_.erase(0, message_length);
        }
    }